

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_vars.cc
# Opt level: O2

void tcmalloc::Static::InitStaticVars(void)

{
  char *value;
  undefined1 *this;
  int i;
  ulong cl;
  
  SizeMap::Init((SizeMap *)&sizemap_);
  PageHeapAllocator<tcmalloc::Span>::Init((PageHeapAllocator<tcmalloc::Span> *)span_allocator_);
  PageHeapAllocator<tcmalloc::Span>::New((PageHeapAllocator<tcmalloc::Span> *)span_allocator_);
  PageHeapAllocator<tcmalloc::Span>::New((PageHeapAllocator<tcmalloc::Span> *)span_allocator_);
  PageHeapAllocator<tcmalloc::StackTrace>::Init
            ((PageHeapAllocator<tcmalloc::StackTrace> *)stacktrace_allocator_);
  this = central_cache_;
  for (cl = 0; cl < DAT_00125d90; cl = cl + 1) {
    CentralFreeList::Init((CentralFreeList *)this,cl);
    this = (undefined1 *)((long)this + 0x4c0);
  }
  PageHeap::PageHeap((PageHeap *)pageheap_,_DAT_00125d88);
  value = TCMallocGetenvSafe("TCMALLOC_AGGRESSIVE_DECOMMIT");
  pageheap_[0x1830dc] = commandlineflags::StringToBool(value,false);
  inited_ = 1;
  DLL_Init((Span *)sampled_objects_);
  return;
}

Assistant:

void Static::InitStaticVars() {
  sizemap_.Init();
  span_allocator_.Init();
  span_allocator_.New(); // Reduce cache conflicts
  span_allocator_.New(); // Reduce cache conflicts
  stacktrace_allocator_.Init();

  for (int i = 0; i < num_size_classes(); ++i) {
    central_cache_[i].Init(i);
  }

  new (pageheap()) PageHeap(sizemap_.min_span_size_in_pages());

#if defined(ENABLE_AGGRESSIVE_DECOMMIT_BY_DEFAULT)
  const bool kDefaultAggressiveDecommit = true;
#else
  const bool kDefaultAggressiveDecommit = false;
#endif


  bool aggressive_decommit =
    tcmalloc::commandlineflags::StringToBool(
      TCMallocGetenvSafe("TCMALLOC_AGGRESSIVE_DECOMMIT"),
                         kDefaultAggressiveDecommit);

  pageheap()->SetAggressiveDecommit(aggressive_decommit);

  inited_ = true;

  DLL_Init(&sampled_objects_);
}